

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O0

int * Gia_SortFloats(float *pArray,int *pPerm,int nSize)

{
  int local_20;
  int i;
  int nSize_local;
  int *pPerm_local;
  float *pArray_local;
  
  _i = pPerm;
  if (pPerm == (int *)0x0) {
    _i = (int *)malloc((long)nSize << 2);
    for (local_20 = 0; local_20 < nSize; local_20 = local_20 + 1) {
      _i[local_20] = local_20;
    }
  }
  minisat_sort3(pArray,_i,nSize);
  return _i;
}

Assistant:

int * Gia_SortFloats( float * pArray, int * pPerm, int nSize )
{
    int i;
    if ( pPerm == NULL )
    {
        pPerm = ABC_ALLOC( int, nSize );
        for ( i = 0; i < nSize; i++ )
            pPerm[i] = i;
    }
    minisat_sort3( pArray, pPerm, nSize );
//    for ( i = 1; i < nSize; i++ )
//        assert( pArray[i-1] <= pArray[i] );
    return pPerm;
}